

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

int xmlValidateElementContent
              (xmlValidCtxtPtr ctxt,xmlNodePtr child,xmlElementPtr elemDecl,int warn,
              xmlNodePtr parent)

{
  char cVar1;
  xmlElementType xVar2;
  xmlElementContentPtr content;
  xmlNodePtr *ppxVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  xmlRegExecCtxtPtr exec;
  size_t sVar7;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar8;
  xmlRegexpPtr comp;
  xmlChar *str1;
  xmlChar *str2;
  char *msg;
  xmlChar *pxVar9;
  char list [5000];
  xmlChar fn [50];
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return -1;
  }
  str1 = elemDecl->name;
  content = elemDecl->content;
  comp = elemDecl->contModel;
  iVar4 = 1;
  if (comp == (xmlRegexpPtr)0x0) {
    iVar4 = xmlValidBuildContentModel(ctxt,elemDecl);
    comp = elemDecl->contModel;
    if (comp == (xmlRegexpPtr)0x0) {
      return -1;
    }
  }
  iVar5 = xmlRegexpIsDeterminist(comp);
  if (iVar5 == 0) {
    return -1;
  }
  ctxt->nodeNr = 0;
  ctxt->nodeMax = 0;
  ctxt->nodeTab = (xmlNodePtr *)0x0;
  exec = xmlRegNewExecCtxt(elemDecl->contModel,(xmlRegExecCallbacks)0x0,(void *)0x0);
  if (exec == (xmlRegExecCtxtPtr)0x0) {
    xmlVErrMemory(ctxt);
    return -1;
  }
  if (child != (xmlNodePtr)0x0) {
    pxVar8 = child;
    do {
      while (xVar2 = pxVar8->type, xVar2 != XML_ENTITY_REF_NODE) {
        if (xVar2 == XML_ELEMENT_NODE) {
          if ((pxVar8->ns == (xmlNs *)0x0) ||
             (pxVar9 = pxVar8->ns->prefix, pxVar9 == (xmlChar *)0x0)) {
            iVar4 = xmlRegExecPushString(exec,pxVar8->name,(void *)0x0);
          }
          else {
            pxVar9 = xmlBuildQName(pxVar8->name,pxVar9,fn,0x32);
            if (pxVar9 == (xmlChar *)0x0) goto LAB_001595cc;
            iVar4 = xmlRegExecPushString(exec,pxVar9,(void *)0x0);
            if ((pxVar9 != fn) && (pxVar9 != pxVar8->name)) {
              (*xmlFree)(pxVar9);
            }
          }
        }
        else if (xVar2 == XML_TEXT_NODE) {
          iVar5 = xmlIsBlankNode(pxVar8);
          if (iVar5 == 0) goto LAB_001595d4;
        }
        else if (xVar2 == XML_CDATA_SECTION_NODE) goto LAB_001595d4;
LAB_00159563:
        if (iVar4 == -5) {
          xmlVErrMemory(ctxt);
        }
        while (pxVar8 = pxVar8->next, pxVar8 == (_xmlNode *)0x0) {
          iVar5 = ctxt->nodeNr;
          if ((long)iVar5 < 1) goto LAB_001595b7;
          uVar6 = iVar5 - 1;
          ctxt->nodeNr = uVar6;
          ppxVar3 = ctxt->nodeTab;
          if (iVar5 == 1) {
            pxVar8 = (xmlNodePtr)0x0;
          }
          else {
            pxVar8 = ppxVar3[(long)iVar5 + -2];
          }
          ctxt->node = pxVar8;
          pxVar8 = ppxVar3[uVar6];
          ppxVar3[uVar6] = (xmlNodePtr)0x0;
          if (pxVar8 == (xmlNodePtr)0x0) goto LAB_001595b7;
        }
      }
      if ((pxVar8->children == (_xmlNode *)0x0) || (pxVar8->children->children == (_xmlNode *)0x0))
      goto LAB_00159563;
      iVar5 = nodeVPush(ctxt,pxVar8);
      if (iVar5 < 0) goto LAB_001595d4;
      pxVar8 = pxVar8->children->children;
    } while (pxVar8 != (_xmlNode *)0x0);
  }
LAB_001595b7:
  iVar4 = xmlRegExecPushString(exec,(xmlChar *)0x0,(void *)0x0);
  if (iVar4 == -5) {
LAB_001595cc:
    xmlVErrMemory(ctxt);
LAB_001595d4:
    xmlRegFreeExecCtxt(exec);
  }
  else {
    xmlRegFreeExecCtxt(exec);
    if ((iVar4 == -3) || (iVar4 == 1)) {
      iVar5 = 1;
      if (iVar4 != -3) {
        iVar5 = iVar4;
      }
      goto LAB_00159832;
    }
  }
  fn[0] = '\0';
  xmlSnprintfElementContent((char *)fn,5000,content,1);
  list[0] = '\0';
  if (child != (xmlNodePtr)0x0) {
    sVar7 = strlen(list);
    (list + sVar7)[0] = '(';
    (list + sVar7)[1] = '\0';
    do {
      sVar7 = strlen(list);
      uVar6 = (uint)sVar7;
      if (0x1356 < (int)uVar6) {
        if (uVar6 < 0x1384) {
          cVar1 = list[(int)(uVar6 - 1)];
joined_r0x001597aa:
          if (cVar1 != '.') {
            sVar7 = strlen(list);
            builtin_strncpy(list + sVar7," ...",5);
          }
        }
        goto LAB_001597c3;
      }
      switch(child->type) {
      case XML_ELEMENT_NODE:
        iVar4 = xmlStrlen(child->name);
        if ((child->ns != (xmlNs *)0x0) && (pxVar9 = child->ns->prefix, pxVar9 != (xmlChar *)0x0)) {
          iVar5 = xmlStrlen(pxVar9);
          iVar4 = iVar4 + iVar5 + 1;
        }
        if ((int)(5000 - uVar6) < iVar4 + 10) {
          cVar1 = list[(int)(uVar6 - 1)];
          goto joined_r0x001597aa;
        }
        if ((child->ns != (xmlNs *)0x0) && (pxVar9 = child->ns->prefix, pxVar9 != (xmlChar *)0x0)) {
          strcat(list,(char *)pxVar9);
          sVar7 = strlen(list);
          (list + sVar7)[0] = ':';
          (list + sVar7)[1] = '\0';
        }
        if (child->name != (xmlChar *)0x0) {
          strcat(list,(char *)child->name);
        }
        break;
      case XML_ATTRIBUTE_NODE:
      case XML_DOCUMENT_NODE:
      case XML_DOCUMENT_TYPE_NODE:
      case XML_DOCUMENT_FRAG_NODE:
      case XML_NOTATION_NODE:
      case XML_HTML_DOCUMENT_NODE:
      case XML_NAMESPACE_DECL:
        sVar7 = strlen(list);
        builtin_strncpy(list + sVar7,"???",4);
        break;
      case XML_TEXT_NODE:
        iVar4 = xmlIsBlankNode(child);
        if (iVar4 == 0) goto switchD_0015965c_caseD_4;
        goto switchD_0015965c_caseD_6;
      case XML_CDATA_SECTION_NODE:
      case XML_ENTITY_REF_NODE:
switchD_0015965c_caseD_4:
        sVar7 = strlen(list);
        builtin_strncpy(list + sVar7,"CDATA",6);
        break;
      default:
        goto switchD_0015965c_caseD_6;
      }
      if (child->next != (_xmlNode *)0x0) {
        sVar7 = strlen(list);
        (list + sVar7)[0] = ' ';
        (list + sVar7)[1] = '\0';
      }
switchD_0015965c_caseD_6:
      child = child->next;
    } while (child != (_xmlNode *)0x0);
    sVar7 = strlen(list);
    (list + sVar7)[0] = ')';
    (list + sVar7)[1] = '\0';
  }
LAB_001597c3:
  if (str1 == (xmlChar *)0x0) {
    str2 = (xmlChar *)list;
    msg = "Element content does not follow the DTD, expecting %s, got %s\n";
    pxVar9 = (xmlChar *)0x0;
    str1 = fn;
  }
  else {
    pxVar9 = (xmlChar *)list;
    msg = "Element %s content does not follow the DTD, expecting %s, got %s\n";
    str2 = fn;
  }
  xmlDoErrValid(ctxt,(xmlNodePtr)CONCAT44(in_register_0000000c,warn),XML_DTD_CONTENT_MODEL,2,str1,
                str2,pxVar9,0,msg,str1,str2,pxVar9);
  iVar5 = 0;
LAB_00159832:
  ctxt->nodeNr = 0;
  ctxt->nodeMax = 0;
  if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
    (*xmlFree)(ctxt->nodeTab);
    ctxt->nodeTab = (xmlNodePtr *)0x0;
  }
  return iVar5;
}

Assistant:

static int
xmlValidateElementContent(xmlValidCtxtPtr ctxt, xmlNodePtr child,
       xmlElementPtr elemDecl, int warn, xmlNodePtr parent) {
    int ret = 1;
#ifndef  LIBXML_REGEXP_ENABLED
    xmlNodePtr repl = NULL, last = NULL, tmp;
#endif
    xmlNodePtr cur;
    xmlElementContentPtr cont;
    const xmlChar *name;

    if ((elemDecl == NULL) || (parent == NULL) || (ctxt == NULL))
	return(-1);
    cont = elemDecl->content;
    name = elemDecl->name;

#ifdef LIBXML_REGEXP_ENABLED
    /* Build the regexp associated to the content model */
    if (elemDecl->contModel == NULL)
	ret = xmlValidBuildContentModel(ctxt, elemDecl);
    if (elemDecl->contModel == NULL) {
	return(-1);
    } else {
	xmlRegExecCtxtPtr exec;

	if (!xmlRegexpIsDeterminist(elemDecl->contModel)) {
	    return(-1);
	}
	ctxt->nodeMax = 0;
	ctxt->nodeNr = 0;
	ctxt->nodeTab = NULL;
	exec = xmlRegNewExecCtxt(elemDecl->contModel, NULL, NULL);
	if (exec == NULL) {
            xmlVErrMemory(ctxt);
            return(-1);
        }
        cur = child;
        while (cur != NULL) {
            switch (cur->type) {
                case XML_ENTITY_REF_NODE:
                    /*
                     * Push the current node to be able to roll back
                     * and process within the entity
                     */
                    if ((cur->children != NULL) &&
                        (cur->children->children != NULL)) {
                        if (nodeVPush(ctxt, cur) < 0) {
                            ret = -1;
                            goto fail;
                        }
                        cur = cur->children->children;
                        continue;
                    }
                    break;
                case XML_TEXT_NODE:
                    if (xmlIsBlankNode(cur))
                        break;
                    ret = 0;
                    goto fail;
                case XML_CDATA_SECTION_NODE:
                    /* TODO */
                    ret = 0;
                    goto fail;
                case XML_ELEMENT_NODE:
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlChar fn[50];
                        xmlChar *fullname;

                        fullname = xmlBuildQName(cur->name,
                                                 cur->ns->prefix, fn, 50);
                        if (fullname == NULL) {
                            xmlVErrMemory(ctxt);
                            ret = -1;
                            goto fail;
                        }
                        ret = xmlRegExecPushString(exec, fullname, NULL);
                        if ((fullname != fn) && (fullname != cur->name))
                            xmlFree(fullname);
                    } else {
                        ret = xmlRegExecPushString(exec, cur->name, NULL);
                    }
                    break;
                default:
                    break;
            }
            if (ret == XML_REGEXP_OUT_OF_MEMORY)
                xmlVErrMemory(ctxt);
            /*
             * Switch to next element
             */
            cur = cur->next;
            while (cur == NULL) {
                cur = nodeVPop(ctxt);
                if (cur == NULL)
                    break;
                cur = cur->next;
            }
        }
        ret = xmlRegExecPushString(exec, NULL, NULL);
        if (ret == XML_REGEXP_OUT_OF_MEMORY)
            xmlVErrMemory(ctxt);
fail:
        xmlRegFreeExecCtxt(exec);
    }
#else  /* LIBXML_REGEXP_ENABLED */
    /*
     * Allocate the stack
     */
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    ctxt->vstateMax = 8;
#else
    ctxt->vstateMax = 1;
#endif
    ctxt->vstateTab = xmlMalloc(ctxt->vstateMax * sizeof(ctxt->vstateTab[0]));
    if (ctxt->vstateTab == NULL) {
	xmlVErrMemory(ctxt);
	return(-1);
    }
    /*
     * The first entry in the stack is reserved to the current state
     */
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    ctxt->nodeTab = NULL;
    ctxt->vstate = &ctxt->vstateTab[0];
    ctxt->vstateNr = 1;
    CONT = cont;
    NODE = child;
    DEPTH = 0;
    OCCURS = 0;
    STATE = 0;
    ret = xmlValidateElementType(ctxt);
    if ((ret == -3) && (warn)) {
	char expr[5000];
	expr[0] = 0;
	xmlSnprintfElementContent(expr, 5000, elemDecl->content, 1);
	xmlErrValidNode(ctxt, (xmlNodePtr) elemDecl,
                XML_DTD_CONTENT_NOT_DETERMINIST,
	        "Content model of %s is not deterministic: %s\n",
	        name, BAD_CAST expr, NULL);
    } else if (ret == -2) {
	/*
	 * An entities reference appeared at this level.
	 * Build a minimal representation of this node content
	 * sufficient to run the validation process on it
	 */
	cur = child;
	while (cur != NULL) {
	    switch (cur->type) {
		case XML_ENTITY_REF_NODE:
		    /*
		     * Push the current node to be able to roll back
		     * and process within the entity
		     */
		    if ((cur->children != NULL) &&
			(cur->children->children != NULL)) {
			if (nodeVPush(ctxt, cur) < 0) {
                            xmlFreeNodeList(repl);
                            ret = -1;
                            goto done;
                        }
			cur = cur->children->children;
			continue;
		    }
		    break;
		case XML_TEXT_NODE:
		    if (xmlIsBlankNode(cur))
			break;
		    /* falls through */
		case XML_CDATA_SECTION_NODE:
		case XML_ELEMENT_NODE:
		    /*
		     * Allocate a new node and minimally fills in
		     * what's required
		     */
		    tmp = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		    if (tmp == NULL) {
			xmlVErrMemory(ctxt);
			xmlFreeNodeList(repl);
			ret = -1;
			goto done;
		    }
		    tmp->type = cur->type;
		    tmp->name = cur->name;
		    tmp->ns = cur->ns;
		    tmp->next = NULL;
		    tmp->content = NULL;
		    if (repl == NULL)
			repl = last = tmp;
		    else {
			last->next = tmp;
			last = tmp;
		    }
		    if (cur->type == XML_CDATA_SECTION_NODE) {
			/*
			 * E59 spaces in CDATA does not match the
			 * nonterminal S
			 */
			tmp->content = xmlStrdup(BAD_CAST "CDATA");
		    }
		    break;
		default:
		    break;
	    }
	    /*
	     * Switch to next element
	     */
	    cur = cur->next;
	    while (cur == NULL) {
		cur = nodeVPop(ctxt);
		if (cur == NULL)
		    break;
		cur = cur->next;
	    }
	}

	/*
	 * Relaunch the validation
	 */
	ctxt->vstate = &ctxt->vstateTab[0];
	ctxt->vstateNr = 1;
	CONT = cont;
	NODE = repl;
	DEPTH = 0;
	OCCURS = 0;
	STATE = 0;
	ret = xmlValidateElementType(ctxt);
    }
#endif /* LIBXML_REGEXP_ENABLED */
    if ((warn) && ((ret != 1) && (ret != -3))) {
	if (ctxt != NULL) {
	    char expr[5000];
	    char list[5000];

	    expr[0] = 0;
	    xmlSnprintfElementContent(&expr[0], 5000, cont, 1);
	    list[0] = 0;
#ifndef LIBXML_REGEXP_ENABLED
	    if (repl != NULL)
		xmlSnprintfElements(&list[0], 5000, repl, 1);
	    else
#endif /* LIBXML_REGEXP_ENABLED */
		xmlSnprintfElements(&list[0], 5000, child, 1);

	    if (name != NULL) {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
	   "Element %s content does not follow the DTD, expecting %s, got %s\n",
		       name, BAD_CAST expr, BAD_CAST list);
	    } else {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
	   "Element content does not follow the DTD, expecting %s, got %s\n",
		       BAD_CAST expr, BAD_CAST list, NULL);
	    }
	} else {
	    if (name != NULL) {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
		       "Element %s content does not follow the DTD\n",
		       name, NULL, NULL);
	    } else {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
		       "Element content does not follow the DTD\n",
		                NULL, NULL, NULL);
	    }
	}
	ret = 0;
    }
    if (ret == -3)
	ret = 1;

#ifndef  LIBXML_REGEXP_ENABLED
done:
    /*
     * Deallocate the copy if done, and free up the validation stack
     */
    while (repl != NULL) {
	tmp = repl->next;
	xmlFree(repl);
	repl = tmp;
    }
    ctxt->vstateMax = 0;
    if (ctxt->vstateTab != NULL) {
	xmlFree(ctxt->vstateTab);
	ctxt->vstateTab = NULL;
    }
#endif
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    if (ctxt->nodeTab != NULL) {
	xmlFree(ctxt->nodeTab);
	ctxt->nodeTab = NULL;
    }
    return(ret);

}